

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_tcp_storage.h
# Opt level: O3

shared_ptr<cppcms::sessions::session_storage> __thiscall
cppcms::sessions::tcp_factory::get(tcp_factory *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<cppcms::sessions::session_storage> sVar2;
  shared_ptr<cppcms::sessions::session_storage> sVar3;
  
  in_RDI->_vptr_session_storage =
       (_func_int **)
       (this->storage_).
       super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->storage_).
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  in_RDI[1]._vptr_session_storage = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = in_RDI;
      return (shared_ptr<cppcms::sessions::session_storage>)
             sVar2.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<cppcms::sessions::session_storage>)
         sVar3.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual booster::shared_ptr<session_storage> get() 
	{
		return storage_;
	}